

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Opnd * __thiscall
GlobOpt::CopyPropReplaceOpnd
          (GlobOpt *this,Instr *instr,Opnd *opnd,StackSym *copySym,IndirOpnd *parentIndirOpnd)

{
  short sVar1;
  code *pcVar2;
  anon_class_24_3_cd72d7c2 fn;
  PropertySymOpnd *sym;
  bool bVar3;
  IRType type;
  uint sourceContextId;
  uint functionId;
  RegOpnd *pRVar4;
  StackSym *pSVar5;
  StackSym *pSVar6;
  undefined4 *puVar7;
  GlobOptBlockData *pGVar8;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  SymOpnd *pSVar10;
  StackSym *pSVar11;
  Opnd *pOVar12;
  Instr *local_60;
  Instr *checkObjTypeInstr;
  PropertySymOpnd *checkObjTypeOpnd;
  PropertySymOpnd *propertySymOpnd;
  StackSym *newSym;
  RegOpnd *regOpnd;
  IndirOpnd *parentIndirOpnd_local;
  StackSym *copySym_local;
  Opnd *opnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  regOpnd = (RegOpnd *)parentIndirOpnd;
  parentIndirOpnd_local = (IndirOpnd *)copySym;
  copySym_local = (StackSym *)opnd;
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    pOVar12 = IR::Instr::GetSrc1(instr);
    pSVar11 = copySym_local;
    if (((opnd != pOVar12) &&
        (pSVar6 = (StackSym *)IR::Instr::GetSrc2((Instr *)opnd_local), pSVar5 = copySym_local,
        pSVar11 != pSVar6)) &&
       ((pSVar11 = (StackSym *)IR::Instr::GetDst((Instr *)opnd_local), pSVar5 != pSVar11 ||
        (bVar3 = IR::Opnd::IsIndirOpnd((Opnd *)copySym_local), !bVar3)))) goto LAB_005909d6;
  }
  else {
    pRVar4 = IR::IndirOpnd::GetBaseOpnd(parentIndirOpnd);
    pSVar11 = copySym_local;
    if (((RegOpnd *)opnd != pRVar4) &&
       (pSVar5 = (StackSym *)IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)regOpnd), pSVar11 != pSVar5))
    {
LAB_005909d6:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xfa6,
                         "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                         ,
                         "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  pGVar8 = CurrentBlockData(this);
  bVar3 = GlobOptBlockData::IsLive(pGVar8,(Sym *)parentIndirOpnd_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xfa7,"(CurrentBlockData()->IsLive(copySym))",
                       "CurrentBlockData()->IsLive(copySym)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  propertySymOpnd = (PropertySymOpnd *)parentIndirOpnd_local;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId);
  if (bVar3) {
    Output::Print(L"TRACE ");
    bVar3 = IsLoopPrePass(this);
    if (bVar3) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    IR::Opnd::Dump((Opnd *)copySym_local);
    Output::Print(L" : ");
    Output::Print(L"Copy prop s%d\n",(ulong)*(uint *)&(propertySymOpnd->super_SymOpnd).m_sym);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FieldCopyPropPhase);
  if (bVar3) {
    IR::Instr::DumpFieldCopyPropTestTrace
              ((Instr *)opnd_local,(bool)((byte)(*(uint *)&this->field_0xf4 >> 5) & 1));
  }
  CaptureByteCodeSymUses(this,(Instr *)opnd_local);
  bVar3 = IR::Opnd::IsRegOpnd((Opnd *)copySym_local);
  if (bVar3) {
    newSym = (StackSym *)IR::Opnd::AsRegOpnd((Opnd *)copySym_local);
    *(PropertySymOpnd **)&(newSym->super_Sym).m_id = propertySymOpnd;
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)newSym,true);
    IR::Opnd::SetIsDead((Opnd *)newSym,false);
    if (regOpnd != (RegOpnd *)0x0) {
      return (Opnd *)newSym;
    }
  }
  else {
    if ((this->currentBlock->loop != (Loop *)0x0) &&
       (bVar3 = IR::Opnd::IsSymOpnd((Opnd *)copySym_local), bVar3)) {
      pSVar10 = IR::Opnd::AsSymOpnd((Opnd *)copySym_local);
      bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar10);
      if (bVar3) {
        checkObjTypeOpnd = IR::Opnd::AsPropertySymOpnd((Opnd *)copySym_local);
        bVar3 = CheckIfPropOpEmitsTypeCheck(this,(Instr *)opnd_local,checkObjTypeOpnd);
        if (bVar3) {
          pBVar9 = IR::PropertySymOpnd::GetGuardedPropOps(checkObjTypeOpnd);
          if (pBVar9 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfd1,"(propertySymOpnd->GetGuardedPropOps() == nullptr)",
                               "propertySymOpnd->GetGuardedPropOps() == nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          checkObjTypeInstr =
               (Instr *)CreateOpndForTypeCheckOnly
                                  (this,checkObjTypeOpnd,(Func *)opnd_local[2]._vptr_Opnd);
          local_60 = IR::Instr::New(CheckObjType,(Func *)opnd_local[2]._vptr_Opnd);
          IR::Instr::SetSrc1(local_60,(Opnd *)checkObjTypeInstr);
          IR::Instr::SetByteCodeOffset(local_60,(Instr *)opnd_local);
          IR::Instr::InsertBefore((Instr *)opnd_local,local_60);
          FinishOptPropOp(this,local_60,(PropertySymOpnd *)checkObjTypeInstr,(BasicBlock *)0x0,false
                          ,(bool *)0x0,(bool *)0x0);
          bVar3 = IR::PropertySymOpnd::IsTypeChecked(checkObjTypeOpnd);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfdf,"(!propertySymOpnd->IsTypeChecked())",
                               "!propertySymOpnd->IsTypeChecked()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          local_60 = SetTypeCheckBailOut(this,(Opnd *)checkObjTypeInstr,local_60,(BailOutInfo *)0x0)
          ;
          bVar3 = IR::Instr::HasBailOutInfo(local_60);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfe1,"(checkObjTypeInstr->HasBailOutInfo())",
                               "checkObjTypeInstr->HasBailOutInfo()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          if ((this->currentBlock->loop != (Loop *)0x0) && (bVar3 = IsLoopPrePass(this), !bVar3)) {
            fn.checkObjTypeInstr = &local_60;
            fn.this = this;
            fn.copySym = (StackSym **)&parentIndirOpnd_local;
            TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::CopyPropReplaceOpnd(IR::Instr*,IR::Opnd*,StackSym*,IR::IndirOpnd*)::__0>
                      (this,local_60,fn);
          }
        }
      }
    }
    bVar3 = IR::Opnd::IsSymOpnd((Opnd *)copySym_local);
    if ((bVar3) && (bVar3 = IR::Opnd::GetIsDead((Opnd *)copySym_local), bVar3)) {
      pSVar10 = IR::Opnd::AsSymOpnd((Opnd *)copySym_local);
      EndFieldLifetime(this,pSVar10);
    }
    sym = propertySymOpnd;
    type = IR::Opnd::GetType((Opnd *)copySym_local);
    newSym = (StackSym *)IR::RegOpnd::New((StackSym *)sym,type,(Func *)opnd_local[2]._vptr_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)newSym,true);
    IR::Instr::ReplaceSrc((Instr *)opnd_local,(Opnd *)copySym_local,(Opnd *)newSym);
  }
  sVar1 = *(short *)&opnd_local[3]._vptr_Opnd;
  if (sVar1 == 0x2b) {
    *(undefined2 *)&opnd_local[3]._vptr_Opnd = 0x2a;
    goto LAB_0059127f;
  }
  if (sVar1 == 0x45) {
    pOVar12 = IR::Instr::GetDst((Instr *)opnd_local);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar12);
    if (bVar3) {
      pOVar12 = IR::Instr::GetSrc1((Instr *)opnd_local);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar12);
      if (bVar3) {
        pOVar12 = IR::Instr::GetDst((Instr *)opnd_local);
        pRVar4 = IR::Opnd::AsRegOpnd(pOVar12);
        pSVar11 = IR::Opnd::GetStackSym(&pRVar4->super_Opnd);
        pOVar12 = IR::Instr::GetSrc1((Instr *)opnd_local);
        pRVar4 = IR::Opnd::AsRegOpnd(pOVar12);
        pSVar5 = IR::Opnd::GetStackSym(&pRVar4->super_Opnd);
        if (pSVar11 == pSVar5) {
          InsertByteCodeUses(this,(Instr *)opnd_local,true);
          *(undefined2 *)&opnd_local[3]._vptr_Opnd = 6;
        }
      }
    }
    goto LAB_0059127f;
  }
  if (((((sVar1 == 0x5e) || (sVar1 == 0x66)) || (sVar1 == 0x68)) ||
      ((sVar1 == 0x6a || (sVar1 == 0x6c)))) || ((sVar1 == 0x6e || ((ushort)(sVar1 - 0x84U) < 2)))) {
LAB_00591254:
    *(undefined2 *)&opnd_local[3]._vptr_Opnd = 0x45;
  }
  else {
    if (sVar1 != 0x8c) {
      if ((sVar1 == 0x123) || (sVar1 == 0x131)) goto LAB_00591254;
      if (sVar1 == 0x1f5) {
        *(undefined2 *)&opnd_local[3]._vptr_Opnd = 0x45;
        IR::Instr::ClearBailOutInfo((Instr *)opnd_local);
        goto LAB_0059127f;
      }
      if (sVar1 != 0x1f6) {
        if (sVar1 == 0x1f8) {
          pOVar12 = IR::Instr::GetSrc2((Instr *)opnd_local);
          bVar3 = IR::Opnd::IsRegOpnd(pOVar12);
          if (bVar3) {
            *(undefined2 *)&opnd_local[3]._vptr_Opnd = 0x1f7;
            IR::Instr::FreeSrc2((Instr *)opnd_local);
            return (Opnd *)0x0;
          }
        }
        goto LAB_0059127f;
      }
    }
    pOVar12 = IR::Instr::GetDst((Instr *)opnd_local);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar12);
    if (bVar3) {
      pOVar12 = IR::Instr::GetSrc1((Instr *)opnd_local);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar12);
      if (bVar3) {
        pOVar12 = IR::Instr::GetDst((Instr *)opnd_local);
        pRVar4 = IR::Opnd::AsRegOpnd(pOVar12);
        pSVar11 = IR::Opnd::GetStackSym(&pRVar4->super_Opnd);
        pOVar12 = IR::Instr::GetSrc1((Instr *)opnd_local);
        pRVar4 = IR::Opnd::AsRegOpnd(pOVar12);
        pSVar5 = IR::Opnd::GetStackSym(&pRVar4->super_Opnd);
        if (pSVar11 == pSVar5) {
          InsertByteCodeUses(this,(Instr *)opnd_local,true);
          *(undefined2 *)&opnd_local[3]._vptr_Opnd = 6;
          goto LAB_0059127f;
        }
      }
    }
    *(undefined2 *)&opnd_local[3]._vptr_Opnd = 0x45;
  }
LAB_0059127f:
  pGVar8 = CurrentBlockData(this);
  GlobOptBlockData::MarkTempLastUse(pGVar8,(Instr *)opnd_local,(RegOpnd *)newSym);
  return (Opnd *)newSym;
}

Assistant:

IR::Opnd *
GlobOpt::CopyPropReplaceOpnd(IR::Instr * instr, IR::Opnd * opnd, StackSym * copySym, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());
    Assert(CurrentBlockData()->IsLive(copySym));

    IR::RegOpnd *regOpnd;
    StackSym *newSym = copySym;

    GOPT_TRACE_OPND(opnd, _u("Copy prop s%d\n"), newSym->m_id);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
    if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
    {
        instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
    }
#endif

    this->CaptureByteCodeSymUses(instr);
    if (opnd->IsRegOpnd())
    {
        regOpnd = opnd->AsRegOpnd();
        regOpnd->m_sym = newSym;
        regOpnd->SetIsJITOptimizedReg(true);

        // The dead bit on the opnd is specific to the sym it is referencing. Since we replaced the sym, the bit is reset.
        regOpnd->SetIsDead(false);

        if(parentIndirOpnd)
        {
            return regOpnd;
        }
    }
    else
    {
        // If this is an object type specialized field load inside a loop, and it produces a type value which wasn't live
        // before, make sure the type check is left in the loop, because it may be the last type check in the loop protecting
        // other fields which are not hoistable and are lexically upstream in the loop.  If the check is not ultimately
        // needed, the dead store pass will remove it.
        if (this->currentBlock->loop != nullptr && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            IR::PropertySymOpnd* propertySymOpnd = opnd->AsPropertySymOpnd();
            if (CheckIfPropOpEmitsTypeCheck(instr, propertySymOpnd))
            {
                // We only set guarded properties in the dead store pass, so they shouldn't be set here yet. If they were
                // we would need to move them from this operand to the operand which is being copy propagated.
                Assert(propertySymOpnd->GetGuardedPropOps() == nullptr);

                // We're creating a copy of this operand to be reused in the same spot in the flow, so we can copy all
                // flow sensitive fields.  However, we will do only a type check here (no property access) and only for
                // the sake of downstream instructions, so the flags pertaining to this property access are irrelevant.
                IR::PropertySymOpnd* checkObjTypeOpnd = CreateOpndForTypeCheckOnly(propertySymOpnd, instr->m_func);
                IR::Instr* checkObjTypeInstr = IR::Instr::New(Js::OpCode::CheckObjType, instr->m_func);
                checkObjTypeInstr->SetSrc1(checkObjTypeOpnd);
                checkObjTypeInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(checkObjTypeInstr);

                // Since we inserted this instruction before the one that is being processed in natural flow, we must process
                // it for object type spec explicitly here.
                FinishOptPropOp(checkObjTypeInstr, checkObjTypeOpnd);
                Assert(!propertySymOpnd->IsTypeChecked());
                checkObjTypeInstr = this->SetTypeCheckBailOut(checkObjTypeOpnd, checkObjTypeInstr, nullptr);
                Assert(checkObjTypeInstr->HasBailOutInfo());

                if (this->currentBlock->loop && !this->IsLoopPrePass())
                {
                    // Try hoisting this checkObjType.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(checkObjTypeInstr, [&]()
                    {
                        TryHoistInvariant(checkObjTypeInstr, this->currentBlock, NULL, CurrentBlockData()->FindValue(copySym), NULL, true);
                    });
                }
            }
        }

        if (opnd->IsSymOpnd() && opnd->GetIsDead())
        {
            // Take the property sym out of the live fields set
            this->EndFieldLifetime(opnd->AsSymOpnd());
        }
        regOpnd = IR::RegOpnd::New(newSym, opnd->GetType(), instr->m_func);
        regOpnd->SetIsJITOptimizedReg(true);
        instr->ReplaceSrc(opnd, regOpnd);
    }

    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        break;

    case Js::OpCode::StSlotChkUndecl:
        if (instr->GetSrc2()->IsRegOpnd())
        {
            // Src2 here should refer to the same location as the Dst operand, which we need to keep live
            // due to the implicit read for ChkUndecl.
            instr->m_opcode = Js::OpCode::StSlot;
            instr->FreeSrc2();
            return nullptr;
        }
        break;

    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::ScopedLdFld:
    case Js::OpCode::ScopedLdFldForTypeOf:
        instr->m_opcode = Js::OpCode::Ld_A;
        break;

    case Js::OpCode::LdMethodFromFlags:
        // The bailout is checked on the loop top and we don't need to check bailout again in loop.
        instr->m_opcode = Js::OpCode::Ld_A;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::TypeofElem:
        instr->m_opcode = Js::OpCode::Typeof;
        break;
    }
    CurrentBlockData()->MarkTempLastUse(instr, regOpnd);

    return regOpnd;
}